

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_ctr(ptls_cipher_suite_t *cs,uint8_t *key,size_t key_len,void *iv,size_t iv_len,
             void *expected,size_t expected_len)

{
  ptls_cipher_algorithm_t *algo;
  int iVar1;
  ptls_cipher_context_t *__ptr;
  uint8_t buf [64];
  undefined1 local_78 [72];
  
  if (cs != (ptls_cipher_suite_t *)0x0) {
    algo = cs->aead->ctr_cipher;
    _ok((uint)(algo->key_size == key_len),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x1ab);
    _ok((uint)(algo->iv_size == 0x10),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x1ac);
    __ptr = ptls_cipher_new(algo,1,key);
    if (__ptr == (ptls_cipher_context_t *)0x0) {
      __assert_fail("ctx != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
                    0x1af,
                    "void test_ctr(ptls_cipher_suite_t *, const uint8_t *, size_t, const void *, size_t, const void *, size_t)"
                   );
    }
    (*__ptr->do_init)(__ptr,iv);
    (*__ptr->do_transform)(__ptr,local_78,"",(size_t)expected);
    (*__ptr->do_dispose)(__ptr);
    free(__ptr);
    iVar1 = bcmp(local_78,(void *)iv_len,(size_t)expected);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x1b4);
  }
  return;
}

Assistant:

static void test_ctr(ptls_cipher_suite_t *cs, const uint8_t *key, size_t key_len, const void *iv, size_t iv_len,
                     const void *expected, size_t expected_len)
{
    static const uint8_t zeroes[64] = {0};

    if (cs == NULL)
        return;

    ptls_cipher_algorithm_t *algo = cs->aead->ctr_cipher;
    uint8_t buf[sizeof(zeroes)];

    assert(expected_len <= sizeof(zeroes));
    ok(algo->key_size == key_len);
    ok(algo->iv_size == iv_len);

    ptls_cipher_context_t *ctx = ptls_cipher_new(algo, 1, key);
    assert(ctx != NULL);
    ptls_cipher_init(ctx, iv);
    ptls_cipher_encrypt(ctx, buf, zeroes, expected_len);
    ptls_cipher_free(ctx);

    ok(memcmp(buf, expected, expected_len) == 0);
}